

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcherData.cpp
# Opt level: O3

void __thiscall ConfusableMatcher::Init(ConfusableMatcher *this)

{
  _WordT *p_Var1;
  ulong uVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  char *pcVar6;
  
  ppVar3 = Ranges.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = Ranges.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (Ranges.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Ranges.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar5 = ppVar4->first;
      uVar2 = ppVar4->second;
      if (uVar5 <= uVar2) {
        do {
          if (0x10fffd < uVar5) {
            pcVar6 = "%s: __position (which is %zu) >= _Nb (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,
                       0x10fffe);
            pcVar6[0] = '\0';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            pcVar6[8] = '\0';
            pcVar6[9] = '\0';
            pcVar6[10] = '\0';
            pcVar6[0xb] = '\0';
            pcVar6[0xc] = '\0';
            pcVar6[0xd] = '\0';
            pcVar6[0xe] = '\0';
            pcVar6[0xf] = '\0';
            pcVar6[0x10] = '\0';
            pcVar6[0x11] = '\0';
            pcVar6[0x12] = '\0';
            pcVar6[0x13] = '\0';
            pcVar6[0x14] = '\0';
            pcVar6[0x15] = '\0';
            pcVar6[0x16] = '\0';
            pcVar6[0x17] = '\0';
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_range_initialize<std::pair<unsigned_long,unsigned_long>const*>();
            return;
          }
          p_Var1 = WordBoundaries.super__Base_bitset<17408UL>._M_w + (uVar5 >> 6);
          *p_Var1 = *p_Var1 | 1L << ((byte)uVar5 & 0x3f);
          uVar5 = uVar5 + 1;
        } while (uVar2 + 1 != uVar5);
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar3);
  }
  return;
}

Assistant:

void ConfusableMatcher::Init()
{
	for (auto range : Ranges) {
		for (auto x = range.first;x <= range.second;x++) {
			ConfusableMatcher::WordBoundaries.set(x, true);
		}
	}
}